

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

Point2f phyr::concentricSampleDisk(Point2f *pt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Point2f PVar4;
  double local_38;
  
  dVar2 = pt->x + pt->x + -1.0;
  local_38 = pt->y + pt->y + -1.0;
  dVar3 = 0.0;
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    dVar1 = 0.0;
    if ((local_38 == 0.0) && (!NAN(local_38))) goto LAB_0010a527;
  }
  if (ABS(dVar2) <= ABS(local_38)) {
    dVar1 = (dVar2 / local_38) * -0.7853981633974483 + 1.5707963267948966;
  }
  else {
    dVar1 = (local_38 / dVar2) * 0.7853981633974483;
    local_38 = dVar2;
  }
  dVar3 = cos(dVar1);
  dVar3 = dVar3 * local_38;
  dVar1 = sin(dVar1);
  dVar1 = dVar1 * local_38;
LAB_0010a527:
  PVar4.y = dVar1;
  PVar4.x = dVar3;
  return PVar4;
}

Assistant:

Point2<T> operator*(U v) const {
        ASSERT(!isNaN(v));
        return Point2<T>(x * v, y * v);
    }